

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol_test.cpp
# Opt level: O0

void protocol_Parse_withTooBigPaddingV0_failsToReadPacket(void)

{
  ProtocolVersion PVar1;
  undefined1 local_98 [8];
  Packet packet;
  string packet_buffer;
  allocator local_29;
  string local_28 [8];
  string user_data;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"user data",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  CreatePacketV0((string *)&packet.field_0x30,(size_t)local_28);
  udpdiscovery::Packet::Packet((Packet *)local_98);
  PVar1 = udpdiscovery::Packet::Parse((Packet *)local_98,(string *)&packet.field_0x30);
  if (PVar1 == kProtocolVersionUnknown) {
    udpdiscovery::Packet::~Packet((Packet *)local_98);
    std::__cxx11::string::~string((string *)&packet.field_0x30);
    std::__cxx11::string::~string(local_28);
    return;
  }
  __assert_fail("packet.Parse(packet_buffer) == udpdiscovery::kProtocolVersionUnknown",
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_protocol_test.cpp"
                ,0x9b,"void protocol_Parse_withTooBigPaddingV0_failsToReadPacket()");
}

Assistant:

void protocol_Parse_withTooBigPaddingV0_failsToReadPacket() {
  std::string user_data("user data");
  std::string packet_buffer =
      CreatePacketV0(user_data, udpdiscovery::kMaxPaddingSizeV0 + 1);

  udpdiscovery::Packet packet;
  assert(packet.Parse(packet_buffer) == udpdiscovery::kProtocolVersionUnknown);
}